

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

float * hdr_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  float *pfVar8;
  stbi_uc *psVar9;
  int *piVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  char buffer [1024];
  char *local_4b0;
  undefined4 local_4a4;
  float *local_4a0;
  ulong local_498;
  int *local_490;
  int local_484;
  stbi_uc *local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  long local_460;
  long local_458;
  float *local_450;
  ulong local_448;
  stbi_uc local_43c;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  hdr_gettoken(s,&local_438);
  if (CONCAT17(cStack_42e,
               CONCAT16(cStack_42f,
                        CONCAT15(cStack_430,
                                 CONCAT14(cStack_431,
                                          CONCAT13(cStack_432,
                                                   CONCAT12(cStack_433,
                                                            CONCAT11(cStack_434,cStack_435))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_431,
               CONCAT16(cStack_432,
                        CONCAT15(cStack_433,
                                 CONCAT14(cStack_434,
                                          CONCAT13(cStack_435,
                                                   CONCAT12(cStack_436,
                                                            CONCAT11(cStack_437,local_438))))))) ==
      0x4e41494441523f23) {
    hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      local_490 = comp;
      do {
        auVar14[0] = -(cStack_431 == '3');
        auVar14[1] = -(cStack_430 == '2');
        auVar14[2] = -(cStack_42f == '-');
        auVar14[3] = -(cStack_42e == 'b');
        auVar14[4] = -(cStack_42d == 'i');
        auVar14[5] = -(cStack_42c == 't');
        auVar14[6] = -(cStack_42b == '_');
        auVar14[7] = -(cStack_42a == 'r');
        auVar14[8] = -(cStack_429 == 'l');
        auVar14[9] = -(cStack_428 == 'e');
        auVar14[10] = -(cStack_427 == '_');
        auVar14[0xb] = -(cStack_426 == 'r');
        auVar14[0xc] = -(cStack_425 == 'g');
        auVar14[0xd] = -(cStack_424 == 'b');
        auVar14[0xe] = -(cStack_423 == 'e');
        auVar14[0xf] = -(cStack_422 == '\0');
        auVar15[0] = -(local_438 == 'F');
        auVar15[1] = -(cStack_437 == 'O');
        auVar15[2] = -(cStack_436 == 'R');
        auVar15[3] = -(cStack_435 == 'M');
        auVar15[4] = -(cStack_434 == 'A');
        auVar15[5] = -(cStack_433 == 'T');
        auVar15[6] = -(cStack_432 == '=');
        auVar15[7] = -(cStack_431 == '3');
        auVar15[8] = -(cStack_430 == '2');
        auVar15[9] = -(cStack_42f == '-');
        auVar15[10] = -(cStack_42e == 'b');
        auVar15[0xb] = -(cStack_42d == 'i');
        auVar15[0xc] = -(cStack_42c == 't');
        auVar15[0xd] = -(cStack_42b == '_');
        auVar15[0xe] = -(cStack_42a == 'r');
        auVar15[0xf] = -(cStack_429 == 'l');
        auVar15 = auVar15 & auVar14;
        if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if ((bVar1) &&
         (local_4b0 = &local_438, hdr_gettoken(s,&local_438),
         cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d)) {
        local_4b0 = &cStack_435;
        local_498 = strtol(local_4b0,&local_4b0,10);
        local_4b0 = local_4b0 + -1;
        do {
          pcVar12 = local_4b0;
          local_4b0 = pcVar12 + 1;
        } while (pcVar12[1] == ' ');
        iVar2 = strncmp(local_4b0,"+X ",3);
        if (iVar2 == 0) {
          local_4b0 = pcVar12 + 4;
          iVar3 = 0;
          uVar7 = strtol(local_4b0,(char **)0x0,10);
          uVar13 = (uint)uVar7;
          *x = uVar13;
          *y = (int)local_498;
          *local_490 = 3;
          iVar2 = 3;
          if (req_comp != 0) {
            iVar2 = req_comp;
          }
          pfVar8 = (float *)malloc((long)(int)(iVar2 * (int)local_498 * uVar13) << 2);
          if (uVar13 - 0x8000 < 0xffff8008) goto LAB_00109a50;
          if ((int)local_498 < 1) {
            psVar9 = (stbi_uc *)0x0;
          }
          else {
            local_478 = (ulong)(uVar13 * 4);
            local_468 = local_498 & 0x7fffffff;
            local_470 = uVar7 & 0x7fffffff;
            local_460 = (uVar7 & 0xffffffff) * (long)iVar2 * 4;
            local_458 = (long)iVar2 << 2;
            uVar7 = 0;
            psVar9 = (stbi_uc *)0x0;
            local_4a0 = pfVar8;
            local_484 = iVar2;
            local_450 = pfVar8;
            do {
              pfVar8 = local_450;
              local_448 = uVar7;
              iVar3 = get8(s);
              iVar4 = get8(s);
              uVar5 = get8(s);
              if (((iVar3 != 2) || (iVar4 != 2)) || ((uVar5 & 0x80) != 0)) {
                local_43c = (stbi_uc)iVar3;
                local_43b = (undefined1)iVar4;
                local_43a = (undefined1)uVar5;
                iVar3 = get8(s);
                local_439 = (undefined1)iVar3;
                hdr_convert(pfVar8,&local_43c,iVar2);
                free(psVar9);
                iVar3 = 0;
                iVar4 = 1;
                do {
                  if ((FILE *)s->img_file == (FILE *)0x0) {
                    local_4a4 = *(undefined4 *)s->img_buffer;
                    s->img_buffer = s->img_buffer + 4;
                  }
                  else {
                    fread(&local_4a4,1,4,(FILE *)s->img_file);
                  }
                  hdr_convert(pfVar8 + (long)(int)(iVar2 * uVar13 * iVar3) + (long)(iVar4 * iVar2),
                              (stbi_uc *)&local_4a4,iVar2);
                  iVar4 = iVar4 + 1;
                  while ((int)uVar13 <= iVar4) {
                    iVar3 = iVar3 + 1;
LAB_00109a50:
                    iVar4 = 0;
                    if ((int)local_498 <= iVar3) {
                      return pfVar8;
                    }
                  }
                } while( true );
              }
              uVar6 = get8(s);
              if ((uVar6 | uVar5 << 8) != uVar13) {
                free(pfVar8);
                free(psVar9);
                failure_reason = "corrupt HDR";
                return (float *)0x0;
              }
              if (psVar9 == (stbi_uc *)0x0) {
                psVar9 = (stbi_uc *)malloc(local_478);
              }
              piVar10 = (int *)0x0;
              local_480 = psVar9;
              do {
                local_490 = piVar10;
                if (0 < (int)uVar13) {
                  iVar2 = 0;
                  do {
                    uVar5 = get8(s);
                    uVar6 = uVar5 & 0xff;
                    if (uVar6 < 0x81) {
                      if (uVar6 != 0) {
                        lVar11 = 0;
                        do {
                          iVar3 = get8(s);
                          psVar9[lVar11 * 4 + (long)iVar2 * 4] = (stbi_uc)iVar3;
                          lVar11 = lVar11 + 1;
                        } while ((uVar5 & 0xff) != (uint)lVar11);
                        iVar2 = iVar2 + (uint)lVar11;
                      }
                    }
                    else {
                      iVar3 = get8(s);
                      lVar11 = 0;
                      do {
                        psVar9[lVar11 * 4 + (long)iVar2 * 4] = (stbi_uc)iVar3;
                        lVar11 = lVar11 + 1;
                      } while ((uVar6 ^ 0x80) + (uint)((uVar6 ^ 0x80) == 0) != (int)lVar11);
                      iVar2 = iVar2 + (int)lVar11;
                    }
                  } while (iVar2 < (int)uVar13);
                }
                lVar11 = local_458;
                iVar2 = local_484;
                piVar10 = (int *)((long)local_490 + 1);
                psVar9 = psVar9 + 1;
              } while (piVar10 != (int *)0x4);
              pfVar8 = local_4a0;
              psVar9 = local_480;
              uVar7 = local_470;
              if (0 < (int)uVar13) {
                do {
                  hdr_convert(pfVar8,psVar9,iVar2);
                  pfVar8 = (float *)((long)pfVar8 + lVar11);
                  psVar9 = psVar9 + 4;
                  uVar7 = uVar7 - 1;
                } while (uVar7 != 0);
              }
              uVar7 = local_448 + 1;
              local_4a0 = (float *)((long)local_4a0 + local_460);
              pfVar8 = local_450;
              psVar9 = local_480;
            } while (uVar7 != local_468);
          }
          free(psVar9);
          return pfVar8;
        }
      }
    }
    failure_reason = "Unsupported HDR format";
  }
  else {
    failure_reason = "Corrupt HDR image";
  }
  return (float *)0x0;
}

Assistant:

static float *hdr_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	float *hdr_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epf("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

   *comp = 3;
	if (req_comp == 0) req_comp = 3;

	// Read data
	hdr_data = (float *) malloc(height * width * req_comp * sizeof(float));

	// Load image data
   // image data is stored as some number of sca
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            getn(s, rgbe, 4);
            hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
	} else {
		// Read RLE-encoded data
		scanline = NULL;

		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4] = { c1,c2,len, get8(s) };
            hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            free(scanline);
            goto main_decode_loop; // yes, this is fucking insane; blame the fucking insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(hdr_data); free(scanline); return epf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) malloc(width * 4);

			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
         for (i=0; i < width; ++i)
            hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
		}
      free(scanline);
	}

   return hdr_data;
}